

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::extractLaneSI8x16(Literal *__return_storage_ptr__,Literal *this,uint8_t index)

{
  reference other;
  LaneArray<16> local_1a0;
  byte local_19;
  Literal *pLStack_18;
  uint8_t index_local;
  Literal *this_local;
  
  local_19 = index;
  pLStack_18 = this;
  this_local = __return_storage_ptr__;
  getLanesSI8x16(&local_1a0,this);
  other = std::array<wasm::Literal,_16UL>::at(&local_1a0,(ulong)local_19);
  Literal(__return_storage_ptr__,other);
  std::array<wasm::Literal,_16UL>::~array(&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::extractLaneSI8x16(uint8_t index) const {
  return getLanesSI8x16().at(index);
}